

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_segment_suite.cpp
# Opt level: O3

void api_suite::api_size(void)

{
  segment sVar1;
  initializer_list<int> input;
  initializer_list<int> input_00;
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  long local_88 [2];
  undefined4 local_78;
  undefined4 local_6c;
  type local_68 [6];
  circular_view<int,_18446744073709551615UL> local_50;
  
  local_50.member.data = local_68;
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  local_50.member.cap = 4;
  local_50.member.size = 0;
  local_50.member.next = 4;
  sVar1 = vista::circular_view<int,_18446744073709551615UL>::first_segment(&local_50);
  local_88[0] = (long)sVar1.member.tail - (long)sVar1.member.head >> 2;
  local_6c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("first.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x70,"void api_suite::api_size()",local_88,&local_6c);
  sVar1 = vista::circular_view<int,_18446744073709551615UL>::last_segment(&local_50);
  local_88[0] = (long)sVar1.member.tail - (long)sVar1.member.head >> 2;
  local_6c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("last.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x72,"void api_suite::api_size()",local_88,&local_6c);
  local_88[0] = CONCAT44(local_88[0]._4_4_,0xb);
  input._M_len = 1;
  input._M_array = (iterator)local_88;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_50,input);
  sVar1 = vista::circular_view<int,_18446744073709551615UL>::first_segment(&local_50);
  local_88[0] = (long)sVar1.member.tail - (long)sVar1.member.head >> 2;
  local_6c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("first.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x77,"void api_suite::api_size()",local_88,&local_6c);
  sVar1 = vista::circular_view<int,_18446744073709551615UL>::last_segment(&local_50);
  local_88[0] = (long)sVar1.member.tail - (long)sVar1.member.head >> 2;
  local_6c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("last.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x79,"void api_suite::api_size()",local_88,&local_6c);
  local_88[0] = 0x160000000b;
  local_88[1] = 0x2c00000021;
  local_78 = 0x37;
  input_00._M_len = 5;
  input_00._M_array = (iterator)local_88;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_50,input_00);
  sVar1 = vista::circular_view<int,_18446744073709551615UL>::first_segment(&local_50);
  local_88[0] = (long)sVar1.member.tail - (long)sVar1.member.head >> 2;
  local_6c = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("first.size()","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x80,"void api_suite::api_size()",local_88,&local_6c);
  sVar1 = vista::circular_view<int,_18446744073709551615UL>::last_segment(&local_50);
  local_88[0] = (long)sVar1.member.tail - (long)sVar1.member.head >> 2;
  local_6c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("last.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x82,"void api_suite::api_size()",local_88,&local_6c);
  return;
}

Assistant:

void api_size()
{
    int array[4] = {};
    circular_view<int> span(array);
    {
        auto first = span.first_segment();
        BOOST_TEST_EQ(first.size(), 0);
        auto last = span.last_segment();
        BOOST_TEST_EQ(last.size(), 0);
    }
    span = { 11 };
    {
        auto first = span.first_segment();
        BOOST_TEST_EQ(first.size(), 1);
        auto last = span.last_segment();
        BOOST_TEST_EQ(last.size(), 0);
    }
    // 55 22 33 44
    // -> <-------
    span = { 11, 22, 33, 44, 55 };
    {
        auto first = span.first_segment();
        BOOST_TEST_EQ(first.size(), 3);
        auto last = span.last_segment();
        BOOST_TEST_EQ(last.size(), 1);
    }
}